

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS
ref_layer_swap(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT site,REF_BOOL *complete)

{
  uint uVar1;
  REF_CAVITY in_RAX;
  undefined8 uVar2;
  char *pcVar3;
  REF_CAVITY ref_cavity;
  REF_CAVITY local_38;
  
  *complete = 0;
  local_38 = in_RAX;
  uVar1 = ref_cavity_create(&local_38);
  if (uVar1 == 0) {
    uVar1 = ref_cavity_form_edge_swap(local_38,ref_grid,node0,node1,site);
    if (uVar1 == 0) {
      uVar1 = ref_cavity_enlarge_combined(local_38);
      if (uVar1 == 0) {
        if (local_38->state == REF_CAVITY_VISIBLE) {
          uVar1 = ref_cavity_replace(local_38);
          if (uVar1 != 0) {
            pcVar3 = "replace";
            uVar2 = 0x367;
            goto LAB_001a65bf;
          }
          *complete = 1;
        }
        uVar1 = ref_cavity_free(local_38);
        if (uVar1 == 0) {
          return 0;
        }
        pcVar3 = "free";
        uVar2 = 0x36a;
      }
      else {
        pcVar3 = "enlarge";
        uVar2 = 0x365;
      }
    }
    else {
      pcVar3 = "form";
      uVar2 = 0x364;
    }
  }
  else {
    pcVar3 = "create";
    uVar2 = 0x362;
  }
LAB_001a65bf:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar2,
         "ref_layer_swap",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_swap(REF_GRID ref_grid, REF_INT node0,
                                         REF_INT node1, REF_INT site,
                                         REF_BOOL *complete) {
  REF_CAVITY ref_cavity;
  *complete = REF_FALSE;
  RSS(ref_cavity_create(&ref_cavity), "create");
  RSS(ref_cavity_form_edge_swap(ref_cavity, ref_grid, node0, node1, site),
      "form");
  RSS(ref_cavity_enlarge_combined(ref_cavity), "enlarge");
  if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
    RSS(ref_cavity_replace(ref_cavity), "replace");
    *complete = REF_TRUE;
  }
  RSS(ref_cavity_free(ref_cavity), "free");
  return REF_SUCCESS;
}